

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# device.cpp
# Opt level: O0

int __thiscall DeviceTy::disassociatePtr(DeviceTy *this,void *HstPtrBegin)

{
  bool bVar1;
  pointer pHVar2;
  list<HostDataToTargetTy,_std::allocator<HostDataToTargetTy>_> *this_00;
  _List_node_base *in_RSI;
  long in_RDI;
  iterator ii;
  list<HostDataToTargetTy,_std::allocator<HostDataToTargetTy>_> *in_stack_ffffffffffffffa8;
  mutex *in_stack_ffffffffffffffb0;
  const_iterator __position;
  _List_const_iterator<HostDataToTargetTy> local_30;
  _Self local_28;
  _Self local_20;
  _List_node_base *local_18;
  
  local_18 = in_RSI;
  std::mutex::lock(in_stack_ffffffffffffffb0);
  local_20._M_node =
       (_List_node_base *)
       std::__cxx11::list<HostDataToTargetTy,_std::allocator<HostDataToTargetTy>_>::begin
                 (in_stack_ffffffffffffffa8);
  do {
    local_28._M_node =
         (_List_node_base *)
         std::__cxx11::list<HostDataToTargetTy,_std::allocator<HostDataToTargetTy>_>::end
                   (in_stack_ffffffffffffffa8);
    bVar1 = std::operator!=(&local_20,&local_28);
    if (!bVar1) {
LAB_0010356d:
      std::mutex::unlock((mutex *)0x10357e);
      return -1;
    }
    __position._M_node = local_18;
    pHVar2 = std::_List_iterator<HostDataToTargetTy>::operator->
                       ((_List_iterator<HostDataToTargetTy> *)0x1034e6);
    if (__position._M_node == (_List_node_base *)pHVar2->HstPtrBegin) {
      pHVar2 = std::_List_iterator<HostDataToTargetTy>::operator->
                         ((_List_iterator<HostDataToTargetTy> *)0x1034fe);
      if (0x1fffffffffffffff < pHVar2->RefCount) {
        this_00 = (list<HostDataToTargetTy,_std::allocator<HostDataToTargetTy>_> *)(in_RDI + 0x20);
        std::_List_const_iterator<HostDataToTargetTy>::_List_const_iterator(&local_30,&local_20);
        std::__cxx11::list<HostDataToTargetTy,_std::allocator<HostDataToTargetTy>_>::erase
                  (this_00,__position);
        std::mutex::unlock((mutex *)0x103550);
        return 0;
      }
      goto LAB_0010356d;
    }
    std::_List_iterator<HostDataToTargetTy>::operator++(&local_20);
  } while( true );
}

Assistant:

int DeviceTy::disassociatePtr(void *HstPtrBegin) {
  DataMapMtx.lock();

  // Check if entry exists
  for (HostDataToTargetListTy::iterator ii = HostDataToTargetMap.begin();
      ii != HostDataToTargetMap.end(); ++ii) {
    if ((uintptr_t)HstPtrBegin == ii->HstPtrBegin) {
      // Mapping exists
      if (CONSIDERED_INF(ii->RefCount)) {
        DP("Association found, removing it\n");
        HostDataToTargetMap.erase(ii);
        DataMapMtx.unlock();
        return OFFLOAD_SUCCESS;
      } else {
        DP("Trying to disassociate a pointer which was not mapped via "
            "omp_target_associate_ptr\n");
        break;
      }
    }
  }

  // Mapping not found
  DataMapMtx.unlock();
  DP("Association not found\n");
  return OFFLOAD_FAIL;
}